

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

bool rsg::LogOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  float fVar1;
  bool bVar2;
  
  bVar2 = outMin <= 6.0 && 0.1 <= outMax;
  if (bVar2) {
    if (outMin <= 0.1) {
      outMin = 0.1;
    }
    fVar1 = expf(outMin);
    *inMin = fVar1;
    if (6.0 <= outMax) {
      outMax = 6.0;
    }
    fVar1 = expf(outMax);
    *inMax = fVar1;
  }
  return bVar2;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		// Limited due to accuracy reasons, should be -inf..+inf
		const float rangeMin = 0.1f;
		const float rangeMax = 6.0f;

		if (outMax < rangeMin || outMin > rangeMax)
			return false; // Out of range

		inMin = deFloatExp(deFloatMax(outMin, rangeMin));
		inMax = deFloatExp(deFloatMin(outMax, rangeMax));

		return true;
	}